

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callable_traits.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Fun_Caller<chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&>
::operator()(Fun_Caller<chaiscript::Boxed_Value,_chaiscript::Boxed_Value,_const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_&>
             *this,Boxed_Value *inner,shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *inner_1
            )

{
  code *pcVar1;
  undefined8 in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  element_type *in_RDI;
  Boxed_Value BVar2;
  Boxed_Value *in_stack_ffffffffffffff98;
  element_type *peVar3;
  undefined1 local_30 [16];
  undefined8 local_20;
  
  pcVar1 = (code *)*in_RSI;
  peVar3 = in_RDI;
  local_20 = in_RCX;
  Boxed_Value::Boxed_Value((Boxed_Value *)in_RDI,in_stack_ffffffffffffff98);
  (*pcVar1)(in_RDI,local_30,local_20);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3b6488);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar3;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(Inner&& ... inner) const {
          return (m_func)(std::forward<Inner>(inner)...);
        }